

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O1

FieldGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetFieldGeneratorInfo
          (Context *this,FieldDescriptor *field)

{
  _Base_ptr p_Var1;
  LogMessage *pLVar2;
  FieldGeneratorInfo *pFVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  LogFinisher local_49;
  LogMessage local_48;
  
  p_Var5 = &(this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var5->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(FieldDescriptor **)(p_Var1 + 1) < field]) {
    if (*(FieldDescriptor **)(p_Var1 + 1) >= field) {
      p_Var4 = p_Var1;
    }
  }
  p_Var1 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var5) &&
     (p_Var1 = p_Var4, field < *(FieldDescriptor **)(p_Var4 + 1))) {
    p_Var1 = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)p_Var1 == p_Var5) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
               ,0xaf);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_48,"Can not find FieldGeneratorInfo for field: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)(*(long *)(field + 8) + 0x20));
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
    pFVar3 = (FieldGeneratorInfo *)0x0;
  }
  else {
    pFVar3 = (FieldGeneratorInfo *)&p_Var1[1]._M_parent;
  }
  return pFVar3;
}

Assistant:

const FieldGeneratorInfo* Context::GetFieldGeneratorInfo(
    const FieldDescriptor* field) const {
  const FieldGeneratorInfo* result =
      FindOrNull(field_generator_info_map_, field);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find FieldGeneratorInfo for field: "
               << field->full_name();
  }
  return result;
}